

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_buffer.c
# Opt level: O0

zip_int64_t read_data(void *state,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  int iVar1;
  buffer_t *pbVar2;
  zip_stat_t *st;
  buffer_t *empty;
  read_data *ctx;
  zip_source_cmd_t cmd_local;
  zip_uint64_t len_local;
  void *data_local;
  void *state_local;
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    *(undefined8 *)(*(long *)((long)state + 0x30) + 0x40) = 0;
    *(undefined8 *)(*(long *)((long)state + 0x30) + 0x48) = 0;
    state_local = (void *)0x0;
    break;
  case ZIP_SOURCE_READ:
    if (len < 0x8000000000000000) {
      state_local = (void *)buffer_read(*(buffer_t **)((long)state + 0x30),(zip_uint8_t *)data,len);
    }
    else {
      zip_error_set((zip_error_t *)state,0x12,0);
      state_local = (void *)0xffffffffffffffff;
    }
    break;
  case ZIP_SOURCE_CLOSE:
    state_local = (void *)0x0;
    break;
  case ZIP_SOURCE_STAT:
    if (len < 0x40) {
      zip_error_set((zip_error_t *)state,0x12,0);
      state_local = (void *)0xffffffffffffffff;
    }
    else {
      zip_stat_init((zip_stat_t *)data);
      *(undefined8 *)((long)data + 0x28) = *(undefined8 *)((long)state + 0x10);
      *(undefined8 *)((long)data + 0x18) = *(undefined8 *)(*(long *)((long)state + 0x30) + 0x38);
      *(undefined8 *)((long)data + 0x20) = *(undefined8 *)((long)data + 0x18);
      *(undefined2 *)((long)data + 0x34) = 0;
      *(undefined2 *)((long)data + 0x36) = 0;
      *(undefined8 *)data = 0xdc;
      state_local = (void *)0x40;
    }
    break;
  case ZIP_SOURCE_ERROR:
    state_local = (void *)zip_error_to_data((zip_error_t *)state,data,len);
    break;
  case ZIP_SOURCE_FREE:
    buffer_free(*(buffer_t **)((long)state + 0x30));
    buffer_free(*(buffer_t **)((long)state + 0x38));
    free(state);
    state_local = (void *)0x0;
    break;
  case ZIP_SOURCE_SEEK:
    iVar1 = buffer_seek(*(buffer_t **)((long)state + 0x30),data,len,(zip_error_t *)state);
    state_local = (void *)(long)iVar1;
    break;
  case ZIP_SOURCE_TELL:
    if (*(ulong *)(*(long *)((long)state + 0x30) + 0x40) < 0x8000000000000000) {
      state_local = *(void **)(*(long *)((long)state + 0x30) + 0x40);
    }
    else {
      zip_error_set((zip_error_t *)state,0x1e,0x4b);
      state_local = (void *)0xffffffffffffffff;
    }
    break;
  case ZIP_SOURCE_BEGIN_WRITE:
    pbVar2 = buffer_new((zip_buffer_fragment_t *)0x0,0,0,(zip_error_t *)state);
    *(buffer_t **)((long)state + 0x38) = pbVar2;
    if (pbVar2 == (buffer_t *)0x0) {
      state_local = (void *)0xffffffffffffffff;
    }
    else {
      *(undefined8 *)(*(long *)((long)state + 0x38) + 0x40) = 0;
      *(undefined8 *)(*(long *)((long)state + 0x38) + 0x48) = 0;
      state_local = (void *)0x0;
    }
    break;
  case ZIP_SOURCE_COMMIT_WRITE:
    buffer_free(*(buffer_t **)((long)state + 0x30));
    *(undefined8 *)((long)state + 0x30) = *(undefined8 *)((long)state + 0x38);
    *(undefined8 *)((long)state + 0x38) = 0;
    state_local = (void *)0x0;
    break;
  case ZIP_SOURCE_ROLLBACK_WRITE:
    buffer_free(*(buffer_t **)((long)state + 0x38));
    *(undefined8 *)((long)state + 0x38) = 0;
    state_local = (void *)0x0;
    break;
  case ZIP_SOURCE_WRITE:
    if (len < 0x8000000000000000) {
      state_local = (void *)buffer_write(*(buffer_t **)((long)state + 0x38),(zip_uint8_t *)data,len,
                                         (zip_error_t *)state);
    }
    else {
      zip_error_set((zip_error_t *)state,0x12,0);
      state_local = (void *)0xffffffffffffffff;
    }
    break;
  case ZIP_SOURCE_SEEK_WRITE:
    iVar1 = buffer_seek(*(buffer_t **)((long)state + 0x38),data,len,(zip_error_t *)state);
    state_local = (void *)(long)iVar1;
    break;
  case ZIP_SOURCE_TELL_WRITE:
    if (*(ulong *)(*(long *)((long)state + 0x38) + 0x40) < 0x8000000000000000) {
      state_local = *(void **)(*(long *)((long)state + 0x38) + 0x40);
    }
    else {
      zip_error_set((zip_error_t *)state,0x1e,0x4b);
      state_local = (void *)0xffffffffffffffff;
    }
    break;
  case ZIP_SOURCE_SUPPORTS:
    state_local = (void *)zip_source_make_command_bitmap
                                    (ZIP_SOURCE_GET_FILE_ATTRIBUTES,0,1,2,3,4,5,6,7,8,0x11,9,0xf,10,
                                     0xc,0xd,0xb,0xffffffff);
    break;
  case ZIP_SOURCE_REMOVE:
    pbVar2 = buffer_new((zip_buffer_fragment_t *)0x0,0,0,(zip_error_t *)state);
    if (pbVar2 == (buffer_t *)0x0) {
      state_local = (void *)0xffffffffffffffff;
    }
    else {
      buffer_free(*(buffer_t **)((long)state + 0x30));
      *(buffer_t **)((long)state + 0x30) = pbVar2;
      state_local = (void *)0x0;
    }
    break;
  default:
    zip_error_set((zip_error_t *)state,0x1c,0);
    state_local = (void *)0xffffffffffffffff;
    break;
  case ZIP_SOURCE_BEGIN_WRITE_CLONING:
    pbVar2 = buffer_clone(*(buffer_t **)((long)state + 0x30),len,(zip_error_t *)state);
    *(buffer_t **)((long)state + 0x38) = pbVar2;
    if (pbVar2 == (buffer_t *)0x0) {
      state_local = (void *)0xffffffffffffffff;
    }
    else {
      *(zip_uint64_t *)(*(long *)((long)state + 0x38) + 0x40) = len;
      *(undefined8 *)(*(long *)((long)state + 0x38) + 0x48) =
           *(undefined8 *)(*(long *)((long)state + 0x38) + 0x10);
      state_local = (void *)0x0;
    }
    break;
  case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
    if (len < 0x18) {
      zip_error_set((zip_error_t *)state,0x12,0);
      state_local = (void *)0xffffffffffffffff;
    }
    else {
      *(undefined8 *)data = *(undefined8 *)((long)state + 0x18);
      *(undefined8 *)((long)data + 8) = *(undefined8 *)((long)state + 0x20);
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)((long)state + 0x28);
      state_local = (void *)0x18;
    }
  }
  return (zip_int64_t)state_local;
}

Assistant:

static zip_int64_t
read_data(void *state, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct read_data *ctx = (struct read_data *)state;

    switch (cmd) {
    case ZIP_SOURCE_BEGIN_WRITE:
	if ((ctx->out = buffer_new(NULL, 0, 0, &ctx->error)) == NULL) {
	    return -1;
	}
	ctx->out->offset = 0;
	ctx->out->current_fragment = 0;
	return 0;

    case ZIP_SOURCE_BEGIN_WRITE_CLONING:
	if ((ctx->out = buffer_clone(ctx->in, len, &ctx->error)) == NULL) {
	    return -1;
	}
	ctx->out->offset = len;
	ctx->out->current_fragment = ctx->out->nfragments;
	return 0;

    case ZIP_SOURCE_CLOSE:
	return 0;

    case ZIP_SOURCE_COMMIT_WRITE:
	buffer_free(ctx->in);
	ctx->in = ctx->out;
	ctx->out = NULL;
	return 0;

    case ZIP_SOURCE_ERROR:
	return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
	buffer_free(ctx->in);
	buffer_free(ctx->out);
	free(ctx);
	return 0;

    case ZIP_SOURCE_GET_FILE_ATTRIBUTES: {
	if (len < sizeof(ctx->attributes)) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}

	memcpy(data, &ctx->attributes, sizeof(ctx->attributes));

	return sizeof(ctx->attributes);
    }

    case ZIP_SOURCE_OPEN:
	ctx->in->offset = 0;
	ctx->in->current_fragment = 0;
	return 0;

    case ZIP_SOURCE_READ:
	if (len > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}
	return buffer_read(ctx->in, data, len);

    case ZIP_SOURCE_REMOVE: {
	buffer_t *empty = buffer_new(NULL, 0, 0, &ctx->error);
	if (empty == NULL) {
	    return -1;
	}

	buffer_free(ctx->in);
	ctx->in = empty;
	return 0;
    }

    case ZIP_SOURCE_ROLLBACK_WRITE:
	buffer_free(ctx->out);
	ctx->out = NULL;
	return 0;

    case ZIP_SOURCE_SEEK:
	return buffer_seek(ctx->in, data, len, &ctx->error);

    case ZIP_SOURCE_SEEK_WRITE:
	return buffer_seek(ctx->out, data, len, &ctx->error);

    case ZIP_SOURCE_STAT: {
	zip_stat_t *st;

	if (len < sizeof(*st)) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}

	st = (zip_stat_t *)data;

	zip_stat_init(st);
	st->mtime = ctx->mtime;
	st->size = ctx->in->size;
	st->comp_size = st->size;
	st->comp_method = ZIP_CM_STORE;
	st->encryption_method = ZIP_EM_NONE;
	st->valid = ZIP_STAT_MTIME | ZIP_STAT_SIZE | ZIP_STAT_COMP_SIZE | ZIP_STAT_COMP_METHOD | ZIP_STAT_ENCRYPTION_METHOD;

	return sizeof(*st);
    }

    case ZIP_SOURCE_SUPPORTS:
	return zip_source_make_command_bitmap(ZIP_SOURCE_GET_FILE_ATTRIBUTES, ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_STAT, ZIP_SOURCE_ERROR, ZIP_SOURCE_FREE, ZIP_SOURCE_SEEK, ZIP_SOURCE_TELL, ZIP_SOURCE_BEGIN_WRITE, ZIP_SOURCE_BEGIN_WRITE_CLONING, ZIP_SOURCE_COMMIT_WRITE, ZIP_SOURCE_REMOVE, ZIP_SOURCE_ROLLBACK_WRITE, ZIP_SOURCE_SEEK_WRITE, ZIP_SOURCE_TELL_WRITE, ZIP_SOURCE_WRITE, -1);

    case ZIP_SOURCE_TELL:
	if (ctx->in->offset > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_TELL, EOVERFLOW);
	    return -1;
	}
	return (zip_int64_t)ctx->in->offset;


    case ZIP_SOURCE_TELL_WRITE:
	if (ctx->out->offset > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_TELL, EOVERFLOW);
	    return -1;
	}
	return (zip_int64_t)ctx->out->offset;

    case ZIP_SOURCE_WRITE:
	if (len > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}
	return buffer_write(ctx->out, data, len, &ctx->error);

    default:
	zip_error_set(&ctx->error, ZIP_ER_OPNOTSUPP, 0);
	return -1;
    }
}